

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O3

void nv12_rgb24_std(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *UV,uint32_t Y_stride,
                   uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint8_t *puVar21;
  uint local_84;
  uint local_7c;
  
  if (height != 1) {
    uVar13 = (ulong)yuv_type;
    iVar9 = Y_stride * 2;
    iVar10 = RGB_stride * 2;
    uVar20 = 0;
    local_7c = 0;
    local_84 = 0;
    do {
      if (width != 1) {
        uVar11 = (local_84 >> 1) * UV_stride;
        bVar1 = YUV2RGB[uVar13].cb_factor;
        bVar2 = YUV2RGB[uVar13].cr_factor;
        bVar3 = YUV2RGB[uVar13].g_cb_factor;
        bVar4 = YUV2RGB[uVar13].g_cr_factor;
        bVar5 = YUV2RGB[uVar13].y_factor;
        bVar6 = YUV2RGB[uVar13].y_offset;
        lVar17 = 0;
        puVar21 = RGB;
        do {
          uVar7 = UV[lVar17 + (ulong)uVar11 + 1];
          iVar14 = (int)(((uint)Y[lVar17 + (ulong)local_7c] - (uint)bVar6) * (uint)bVar5) >> 7;
          iVar16 = (int)((uint)bVar2 * ((int)(char)uVar7 ^ 0xffffff80U)) >> 6;
          iVar15 = iVar14 + iVar16;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          uVar8 = UV[lVar17 + (ulong)uVar11];
          puVar21[uVar20] = (uint8_t)iVar15;
          iVar18 = (int)(((int)(char)uVar7 ^ 0xffffff80U) * (uint)bVar4 +
                        (uint)bVar3 * ((int)(char)uVar8 ^ 0xffffff80U)) >> 7;
          iVar15 = iVar14 - iVar18;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)uVar20 + 1] = (uint8_t)iVar15;
          iVar12 = (int)(((int)(char)uVar8 ^ 0xffffff80U) * (uint)bVar1) >> 6;
          iVar15 = iVar14 + iVar12;
          if (0xfe < iVar14 + iVar12) {
            iVar15 = 0xff;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)uVar20 + 2] = (uint8_t)iVar15;
          iVar14 = (int)(((uint)Y[lVar17 + (ulong)local_7c + 1] - (uint)bVar6) * (uint)bVar5) >> 7;
          iVar15 = iVar14 + iVar16;
          if (0xfe < iVar14 + iVar16) {
            iVar15 = 0xff;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)uVar20 + 3] = (uint8_t)iVar15;
          iVar15 = iVar14 - iVar18;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)uVar20 + 4] = (uint8_t)iVar15;
          iVar19 = 0xff;
          iVar15 = iVar14 + iVar12;
          if (0xfe < iVar14 + iVar12) {
            iVar15 = iVar19;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)uVar20 + 5] = (uint8_t)iVar15;
          iVar14 = (int)(((uint)Y[lVar17 + (ulong)Y_stride] - (uint)bVar6) * (uint)bVar5) >> 7;
          iVar15 = iVar14 + iVar16;
          if (0xfe < iVar14 + iVar16) {
            iVar15 = iVar19;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[RGB_stride] = (uint8_t)iVar15;
          iVar15 = iVar14 - iVar18;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)RGB_stride + 1] = (uint8_t)iVar15;
          iVar15 = iVar14 + iVar12;
          if (0xfe < iVar14 + iVar12) {
            iVar15 = iVar19;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)RGB_stride + 2] = (uint8_t)iVar15;
          iVar14 = (int)(((uint)Y[lVar17 + (ulong)Y_stride + 1] - (uint)bVar6) * (uint)bVar5) >> 7;
          iVar15 = iVar16 + iVar14;
          if (0xfe < iVar16 + iVar14) {
            iVar15 = iVar19;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)RGB_stride + 3] = (uint8_t)iVar15;
          iVar18 = iVar14 - iVar18;
          if (0xfe < iVar18) {
            iVar18 = 0xff;
          }
          if ((short)iVar18 < 1) {
            iVar18 = 0;
          }
          puVar21[(ulong)RGB_stride + 4] = (uint8_t)iVar18;
          iVar15 = iVar14 + iVar12;
          if (0xfe < iVar14 + iVar12) {
            iVar15 = 0xff;
          }
          if ((short)iVar15 < 1) {
            iVar15 = 0;
          }
          puVar21[(ulong)RGB_stride + 5] = (uint8_t)iVar15;
          lVar17 = lVar17 + 2;
          puVar21 = puVar21 + 6;
        } while ((uint)lVar17 < width - 1);
      }
      local_84 = local_84 + 2;
      local_7c = local_7c + iVar9;
      Y_stride = Y_stride + iVar9;
      uVar20 = uVar20 + iVar10;
      RGB_stride = RGB_stride + iVar10;
    } while (local_84 < height - 1);
  }
  return;
}

Assistant:

void nv12_rgb24_std(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *UV, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*uv_ptr=UV+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			int8_t u_tmp, v_tmp;
			u_tmp = uv_ptr[0]-128;
			v_tmp = uv_ptr[1]-128;
			
			//compute Cb Cr color offsets, common to four pixels
			int16_t b_cb_offset, r_cr_offset, g_cbcr_offset;
			b_cb_offset = (param->cb_factor*u_tmp)>>6;
			r_cr_offset = (param->cr_factor*v_tmp)>>6;
			g_cbcr_offset = (param->g_cb_factor*u_tmp + param->g_cr_factor*v_tmp)>>7;
			
			int16_t y_tmp;
			y_tmp = (param->y_factor*(y_ptr1[0]-param->y_offset))>>7;
			rgb_ptr1[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr1[1]-param->y_offset))>>7;
			rgb_ptr1[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[5] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[0]-param->y_offset))>>7;
			rgb_ptr2[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[1]-param->y_offset))>>7;
			rgb_ptr2[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[5] = clamp(y_tmp + b_cb_offset);
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			uv_ptr += 2;
		}
	}
}